

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O2

uintmax_t fs_space_available(string_view path)

{
  string_view path_00;
  string_view fname;
  string_view path_local;
  error_code ec;
  space_info s;
  path local_40;
  
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_40,&path_local,auto_format);
  std::filesystem::space((path *)&s,(error_code *)&local_40);
  std::filesystem::__cxx11::path::~path(&local_40);
  if (ec._M_value != 0) {
    path_00._M_str = path_local._M_str;
    path_00._M_len = path_local._M_len;
    fname._M_str = "fs_space_available";
    fname._M_len = 0x12;
    fs_print_error(path_00,fname,&ec);
    s.available = 0;
  }
  return s.available;
}

Assistant:

std::uintmax_t fs_space_available(std::string_view path)
{
  // filesystem space available for device holding path

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  if(auto s = std::filesystem::space(path, ec); !ec)  FFS_LIKELY
    return s.available;
#elif defined(_WIN32)
  // https://learn.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-getdiskfreespaceexa
  if(ULARGE_INTEGER b;
      GetDiskFreeSpaceExA(path.data(), &b, nullptr, nullptr) != 0)  FFS_LIKELY
    return b.QuadPart;
#elif defined(HAVE_STATVFS)
  // https://www.man7.org/linux/man-pages/man3/statvfs.3.html
  // https://unix.stackexchange.com/a/703650
  struct statvfs stat;
  if (!statvfs(path.data(), &stat))  FFS_LIKELY
    return (stat.f_frsize ? stat.f_frsize : stat.f_bsize) * stat.f_bavail;
#else
  ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error(path, __func__, ec);
  return {};
}